

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O2

integer s_cmp(char *a0,char *b0,ftnlen la,ftnlen lb)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  
  pbVar1 = (byte *)(a0 + la);
  pbVar2 = (byte *)(b0 + lb);
  if (lb < la) {
    for (; b0 < pbVar2; b0 = (char *)((byte *)b0 + 1)) {
      bVar3 = *a0;
      bVar4 = *b0;
      if (bVar3 != bVar4) {
LAB_00111b4e:
        return (uint)bVar3 - (uint)bVar4;
      }
      a0 = (char *)((byte *)a0 + 1);
    }
    while (a0 < pbVar1) {
      bVar3 = *a0;
      a0 = (char *)((byte *)a0 + 1);
      if (bVar3 != 0x20) {
        return bVar3 - 0x20;
      }
    }
  }
  else {
    for (; a0 < pbVar1; a0 = (char *)((byte *)a0 + 1)) {
      bVar3 = *a0;
      bVar4 = *b0;
      if (bVar3 != bVar4) goto LAB_00111b4e;
      b0 = (char *)((byte *)b0 + 1);
    }
    while (b0 < pbVar2) {
      bVar3 = *b0;
      b0 = (char *)((byte *)b0 + 1);
      if (bVar3 != 0x20) {
        return 0x20 - (uint)bVar3;
      }
    }
  }
  return 0;
}

Assistant:

integer
s_cmp(a0, b0, la, lb)
char *a0, *b0;
ftnlen la, lb;
#else
integer
s_cmp(char *a0, char *b0, ftnlen la, ftnlen lb)
#endif
{
    register unsigned char *a, *aend, *b, *bend;
    a = (unsigned char *) a0;
    b = (unsigned char *) b0;
    aend = a + la;
    bend = b + lb;

    if (la <= lb) {
        while (a < aend)
            if (*a != *b)
                return (*a - *b);
            else {
                ++a;
                ++b;
            }

        while (b < bend)
            if (*b != ' ')
                return (' ' - *b);
            else
                ++b;
    }